

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::xoshiro256plus_&,_const_trng::xoshiro256plus_&> * __thiscall
Catch::ExprLhs<trng::xoshiro256plus_const&>::operator==
          (ExprLhs<const_trng::xoshiro256plus_&> *this,xoshiro256plus *rhs)

{
  StringRef op;
  bool comparisonResult;
  xoshiro256plus *in_RSI;
  BinaryExpr<const_trng::xoshiro256plus_&,_const_trng::xoshiro256plus_&> *in_RDI;
  xoshiro256plus *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_trng::xoshiro256plus_&,_const_trng::xoshiro256plus_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<trng::xoshiro256plus,trng::xoshiro256plus>(in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = (char *)(in_RSI->S).r[0];
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::xoshiro256plus_&,_const_trng::xoshiro256plus_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }